

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O0

void PDHG_Compute_Step_Size_Ratio(CUPDLPwork *pdhg)

{
  long lVar1;
  long in_RDI;
  double dVar2;
  double dVar3;
  cupdlp_float dLogBetaUpdate;
  cupdlp_float dBetaUpdate;
  cupdlp_float dDiffDual;
  cupdlp_float dDiffPrimal;
  CUPDLPvec *y;
  CUPDLPvec *x;
  cupdlp_int iter;
  cupdlp_float dMeanStepSize;
  CUPDLPstepsize *stepsize;
  CUPDLPiterates *iterates;
  CUPDLPproblem *problem;
  cupdlp_float *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  cupdlp_int len;
  cupdlp_float *x_00;
  cupdlp_float *x_01;
  CUPDLPwork *in_stack_ffffffffffffffa0;
  
  len = (cupdlp_int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  x_00 = *(cupdlp_float **)(in_RDI + 0x18);
  lVar1 = *(long *)(in_RDI + 0x20);
  dVar2 = sqrt(*(double *)(lVar1 + 8) * *(double *)(lVar1 + 0x10));
  x_01 = x_00;
  cupdlp_diffTwoNorm(in_stack_ffffffffffffffa0,x_00,x_00,len,in_stack_ffffffffffffff80);
  cupdlp_diffTwoNorm(in_stack_ffffffffffffffa0,x_01,x_00,len,in_stack_ffffffffffffff80);
  dVar3 = sqrt(*(double *)(lVar1 + 0x28));
  *(double *)(lVar1 + 8) = dVar2 / dVar3;
  *(double *)(lVar1 + 0x10) = *(double *)(lVar1 + 8) * *(double *)(lVar1 + 0x28);
  *(undefined8 *)(lVar1 + 0x30) = 0x3ff0000000000000;
  return;
}

Assistant:

void PDHG_Compute_Step_Size_Ratio(CUPDLPwork *pdhg) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  cupdlp_float dMeanStepSize =
      sqrt(stepsize->dPrimalStep * stepsize->dDualStep);

  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];

  // cupdlp_float dDiffPrimal = cupdlp_diffTwoNorm(x, iterates->xLastRestart, problem->nCols);
  // cupdlp_float dDiffDual = cupdlp_diffTwoNorm(y, iterates->yLastRestart, problem->nRows);

  cupdlp_float dDiffPrimal = 0.0;
  cupdlp_diffTwoNorm(pdhg, x->data, iterates->xLastRestart, problem->nCols, &dDiffPrimal);
  cupdlp_float dDiffDual = 0.0;
  cupdlp_diffTwoNorm(pdhg, y->data, iterates->yLastRestart, problem->nRows, &dDiffDual);

  if (fmin(dDiffPrimal, dDiffDual) > 1e-10) {
    cupdlp_float dBetaUpdate = dDiffDual / dDiffPrimal;
    cupdlp_float dLogBetaUpdate =
        0.5 * log(dBetaUpdate) + 0.5 * log(sqrt(stepsize->dBeta));
    stepsize->dBeta = exp(dLogBetaUpdate) * exp(dLogBetaUpdate);
  }

  stepsize->dPrimalStep = dMeanStepSize / sqrt(stepsize->dBeta);
  stepsize->dDualStep = stepsize->dPrimalStep * stepsize->dBeta;
  stepsize->dTheta = 1.0;
}